

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O3

ExprNode * parse_atom(ParserState *ps)

{
  void *pvVar1;
  void *pvVar2;
  Token TVar3;
  void *pvVar4;
  _Bool _Var5;
  uint uVar6;
  uint uVar7;
  char *end;
  ExprNode *pEVar8;
  ExprNode *pEVar9;
  ExprNode **ppEVar10;
  char *pcVar11;
  size_t sVar12;
  void *pvVar13;
  size_t sVar14;
  char *end_1;
  size_t __n;
  char *start;
  ptrlen prefix;
  ptrlen input;
  ptrlen input_00;
  ptrlen input_01;
  ptrlen input_02;
  ptrlen input_03;
  ptrlen input_04;
  ptrlen tail;
  ptrlen local_40;
  
  TVar3 = ps->tok;
  if (TVar3 == TOK_ATOM) {
    _Var5 = ptrlen_contains(ps->toktext,":/");
    if (!_Var5) {
      pvVar4 = (ps->toktext).ptr;
      sVar12 = (ps->toktext).len;
      pEVar8 = (ExprNode *)safemalloc(1,0x28,0);
      *(undefined8 *)pEVar8 = 0;
      (pEVar8->text).ptr = (void *)0x0;
      (pEVar8->text).len = 0;
      (pEVar8->field_2).field_0.subexprs = (ExprNode **)0x0;
      (pEVar8->field_2).field_0.nsubexprs = 0;
      pEVar8->op = OP_HOSTNAME_WC;
      (pEVar8->text).ptr = pvVar4;
      (pEVar8->text).len = sVar12;
      ppEVar10 = (ExprNode **)mkstr(ps->toktext);
      (pEVar8->field_2).field_0.subexprs = ppEVar10;
      goto LAB_0016ab44;
    }
    prefix.len = 5;
    prefix.ptr = "port:";
    _Var5 = ptrlen_startswith(ps->toktext,prefix,&local_40);
    if (!_Var5) goto LAB_0016aac6;
    if (CONCAT44(local_40.len._4_4_,(undefined4)local_40.len) != 0) {
      input.ptr._4_4_ = local_40.ptr._4_4_;
      input.ptr._0_4_ = local_40.ptr._0_4_;
      input.len = CONCAT44(local_40.len._4_4_,(undefined4)local_40.len);
      _Var5 = ptrlen_contains_only(input,"0123456789");
      __n = CONCAT44(local_40.len._4_4_,(undefined4)local_40.len);
      if (!_Var5) goto LAB_0016ab98;
      input_00.ptr._4_4_ = local_40.ptr._4_4_;
      input_00.ptr._0_4_ = local_40.ptr._0_4_;
      input_00.len = __n;
      uVar6 = ptrlen_to_port_number(input_00);
      uVar7 = uVar6;
      if (0xffff < uVar6) {
        pcVar11 = dupstr("port number too large");
        if (ps->err != (char *)0x0) goto LAB_0016aad9;
        goto LAB_0016aaea;
      }
LAB_0016ac61:
      pvVar4 = (ps->toktext).ptr;
      sVar12 = (ps->toktext).len;
      pEVar8 = (ExprNode *)safemalloc(1,0x28,0);
      *(undefined8 *)pEVar8 = 0;
      (pEVar8->text).ptr = (void *)0x0;
      (pEVar8->text).len = 0;
      (pEVar8->field_2).field_0.subexprs = (ExprNode **)0x0;
      (pEVar8->field_2).field_0.nsubexprs = 0;
      pEVar8->op = OP_PORT_RANGE;
      (pEVar8->text).ptr = pvVar4;
      (pEVar8->text).len = sVar12;
      (pEVar8->field_2).field_3.lo = uVar7;
      (pEVar8->field_2).field_3.hi = uVar6;
LAB_0016ab44:
      advance(ps);
      return pEVar8;
    }
    __n = 0;
LAB_0016ab98:
    pvVar4 = (void *)CONCAT44(local_40.ptr._4_4_,local_40.ptr._0_4_);
    pvVar13 = memchr(pvVar4,0x2d,__n);
    if (pvVar13 != (void *)0x0) {
      sVar12 = (long)pvVar13 - (long)pvVar4;
      if (pvVar13 < pvVar4) {
LAB_0016ad23:
        __assert_fail("end >= start",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/misc.h",
                      0xbb,"ptrlen make_ptrlen_startend(const void *, const void *)");
      }
      pvVar1 = (void *)((long)pvVar13 + 1);
      pvVar2 = (void *)((long)pvVar4 + __n);
      sVar14 = (long)pvVar2 - (long)pvVar1;
      if (pvVar2 < pvVar1) goto LAB_0016ad23;
      if ((((pvVar13 != pvVar4) &&
           (input_01.len = sVar12, input_01.ptr = pvVar4,
           _Var5 = ptrlen_contains_only(input_01,"0123456789"), pvVar2 != pvVar1)) && (_Var5)) &&
         (input_02.len = sVar14, input_02.ptr = pvVar1,
         _Var5 = ptrlen_contains_only(input_02,"0123456789"), _Var5)) {
        input_03.len = sVar12;
        input_03.ptr = pvVar4;
        uVar7 = ptrlen_to_port_number(input_03);
        if (0xffff < uVar7) {
          pcVar11 = dupstr("port number too large");
          if (ps->err == (char *)0x0) {
            ps->err = pcVar11;
            (ps->errloc).ptr = pvVar4;
            (ps->errloc).len = sVar12;
            return (ExprNode *)0x0;
          }
          goto LAB_0016aad9;
        }
        input_04.len = sVar14;
        input_04.ptr = pvVar1;
        uVar6 = ptrlen_to_port_number(input_04);
        if (0xffff < uVar6) {
          pcVar11 = dupstr("port number too large");
          if (ps->err == (char *)0x0) {
            ps->err = pcVar11;
            (ps->errloc).ptr = pvVar1;
            (ps->errloc).len = sVar14;
            return (ExprNode *)0x0;
          }
          goto LAB_0016aad9;
        }
        if (uVar6 < uVar7) {
          pcVar11 = dupstr("port number range is backwards");
          if ((long)__n < 0) goto LAB_0016ad23;
          if (ps->err == (char *)0x0) {
            ps->err = pcVar11;
            (ps->errloc).ptr = pvVar4;
            (ps->errloc).len = __n;
            return (ExprNode *)0x0;
          }
          goto LAB_0016aad9;
        }
        goto LAB_0016ac61;
      }
    }
    pcVar11 = "unable to parse port number specification";
  }
  else {
    if (TVar3 == TOK_NOT) {
      pvVar4 = (ps->toktext).ptr;
      advance(ps);
      pEVar8 = parse_atom(ps);
      if (pEVar8 == (ExprNode *)0x0) {
        return (ExprNode *)0x0;
      }
      pvVar13 = (void *)((long)(pEVar8->text).ptr + (pEVar8->text).len);
      if (pvVar4 <= pvVar13) {
        pEVar9 = (ExprNode *)safemalloc(1,0x28,0);
        *(undefined8 *)pEVar9 = 0;
        (pEVar9->text).ptr = (void *)0x0;
        (pEVar9->text).len = 0;
        (pEVar9->field_2).field_0.subexprs = (ExprNode **)0x0;
        (pEVar9->field_2).field_0.nsubexprs = 0;
        pEVar9->op = OP_NOT;
        (pEVar9->text).ptr = pvVar4;
        (pEVar9->text).len = (long)pvVar13 - (long)pvVar4;
        (pEVar9->field_2).field_0.subexprs = (ExprNode **)pEVar8;
        return pEVar9;
      }
      goto LAB_0016ad23;
    }
    if (TVar3 == TOK_LPAR) {
      pvVar4 = (ps->toktext).ptr;
      advance(ps);
      pEVar8 = parse_expr(ps);
      if (pEVar8 == (ExprNode *)0x0) {
        return (ExprNode *)0x0;
      }
      if (ps->tok != TOK_RPAR) {
        pcVar11 = dupstr("expected \')\' after parenthesised subexpression");
        if (ps->err == (char *)0x0) {
          pvVar4 = (pEVar8->text).ptr;
          sVar12 = (pEVar8->text).len;
          ps->err = pcVar11;
          (ps->errloc).ptr = pvVar4;
          (ps->errloc).len = sVar12;
        }
        else {
          safefree(pcVar11);
        }
        exprnode_free(pEVar8);
        return (ExprNode *)0x0;
      }
      pvVar13 = (void *)((long)(ps->toktext).ptr + (ps->toktext).len);
      advance(ps);
      if (pvVar4 <= pvVar13) {
        (pEVar8->text).ptr = pvVar4;
        (pEVar8->text).len = (long)pvVar13 - (long)pvVar4;
        return pEVar8;
      }
      goto LAB_0016ad23;
    }
LAB_0016aac6:
    pcVar11 = "expected a predicate or a parenthesised subexpression";
  }
  pcVar11 = dupstr(pcVar11);
  if (ps->err == (char *)0x0) {
    local_40.ptr._0_4_ = *(undefined4 *)&(ps->toktext).ptr;
    local_40.ptr._4_4_ = *(undefined4 *)((long)&(ps->toktext).ptr + 4);
    local_40.len._0_4_ = (undefined4)(ps->toktext).len;
    local_40.len._4_4_ = *(undefined4 *)((long)&(ps->toktext).len + 4);
LAB_0016aaea:
    ps->err = pcVar11;
    *(undefined4 *)&(ps->errloc).ptr = local_40.ptr._0_4_;
    *(undefined4 *)((long)&(ps->errloc).ptr + 4) = local_40.ptr._4_4_;
    *(undefined4 *)&(ps->errloc).len = (undefined4)local_40.len;
    *(undefined4 *)((long)&(ps->errloc).len + 4) = local_40.len._4_4_;
    return (ExprNode *)0x0;
  }
LAB_0016aad9:
  safefree(pcVar11);
  return (ExprNode *)0x0;
}

Assistant:

static ExprNode *parse_atom(ParserState *ps)
{
    if (ps->tok == TOK_LPAR) {
        ptrlen openpar = ps->toktext;
        advance(ps);                   /* eat the ( */

        ExprNode *subexpr = parse_expr(ps);
        if (!subexpr)
            return NULL;

        if (ps->tok != TOK_RPAR) {
            error(ps, dupstr("expected ')' after parenthesised subexpression"),
                  subexpr->text);
            exprnode_free(subexpr);
            return NULL;
        }

        ptrlen closepar = ps->toktext;
        advance(ps);                   /* eat the ) */

        /* We can reuse the existing AST node, but we need to extend
         * its bounds within the input expression to include the
         * parentheses */
        subexpr->text = make_ptrlen_startend(
            openpar.ptr, ptrlen_end(closepar));
        return subexpr;
    }

    if (ps->tok == TOK_NOT) {
        ptrlen notloc = ps->toktext;
        advance(ps);                   /* eat the ! */

        ExprNode *subexpr = parse_atom(ps);
        if (!subexpr)
            return NULL;

        ExprNode *en = exprnode_new(
            OP_NOT, make_ptrlen_startend(
                notloc.ptr, ptrlen_end(subexpr->text)));
        en->subexpr = subexpr;
        return en;
    }

    if (ps->tok == TOK_ATOM) {
        if (atom_is_hostname_wc(ps->toktext)) {
            /* Hostname wildcard. */
            ExprNode *en = exprnode_new(OP_HOSTNAME_WC, ps->toktext);
            en->wc = mkstr(ps->toktext);
            advance(ps);
            return en;
        }

        ptrlen tail;
        if (ptrlen_startswith(ps->toktext, PTRLEN_LITERAL("port:"), &tail)) {
            /* Port number (single or range). */
            unsigned lo, hi;
            char *minus;
            static const char DIGITS[] = "0123456789\0";
            bool parse_ok = false;

            if (tail.len > 0 && ptrlen_contains_only(tail, DIGITS)) {
                lo = ptrlen_to_port_number(tail);
                if (lo >= 65536) {
                    error(ps, dupstr("port number too large"), tail);
                    return NULL;
                }
                hi = lo;
                parse_ok = true;
            } else if ((minus = memchr(tail.ptr, '-', tail.len)) != NULL) {
                ptrlen pl_lo = make_ptrlen_startend(tail.ptr, minus);
                ptrlen pl_hi = make_ptrlen_startend(minus+1, ptrlen_end(tail));
                if (pl_lo.len > 0 && ptrlen_contains_only(pl_lo, DIGITS) &&
                    pl_hi.len > 0 && ptrlen_contains_only(pl_hi, DIGITS)) {

                    lo = ptrlen_to_port_number(pl_lo);
                    if (lo >= 65536) {
                        error(ps, dupstr("port number too large"), pl_lo);
                        return NULL;
                    }

                    hi = ptrlen_to_port_number(pl_hi);
                    if (hi >= 65536) {
                        error(ps, dupstr("port number too large"), pl_hi);
                        return NULL;
                    }

                    if (hi < lo) {
                        error(ps, dupstr("port number range is backwards"),
                              make_ptrlen_startend(pl_lo.ptr,
                                                   ptrlen_end(pl_hi)));
                        return NULL;
                    }

                    parse_ok = true;
                }
            }

            if (!parse_ok) {
                error(ps, dupstr("unable to parse port number specification"),
                      ps->toktext);
                return NULL;
            }


            ExprNode *en = exprnode_new(OP_PORT_RANGE, ps->toktext);
            en->lo = lo;
            en->hi = hi;
            advance(ps);
            return en;
        }
    }

    error(ps, dupstr("expected a predicate or a parenthesised subexpression"),
          ps->toktext);
    return NULL;
}